

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

int getFD(int adr,int heap)

{
  int iVar1;
  FILE *pFVar2;
  int *piVar3;
  long lVar4;
  
  piVar3 = H;
  if (heap == 0) {
    piVar3 = M;
  }
  for (lVar4 = 0; piVar3[adr + lVar4] != 0; lVar4 = lVar4 + 1) {
    tmp[lVar4] = (char)piVar3[adr + lVar4];
  }
  fd = fd + 1;
  pFVar2 = fopen(tmp,"r");
  iVar1 = fd;
  fds[fd] = (FILE *)pFVar2;
  return iVar1;
}

Assistant:

int getFD(int adr, int heap) {
	int cnt = 0; int *P = M;
	FILE *cfd;
	if (heap) { P=H;}
	while (P[adr]!=0) { 
		tmp[cnt++]=(char)P[adr];
		adr++;
	}
	fd++;
	cfd = fopen(tmp,"r");
	fds[fd] = cfd;
	return fd;
}